

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O1

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats,RTCFeatureFlags feature_mask)

{
  ISPCMaterial *pIVar1;
  undefined1 auVar2 [16];
  ISPCOBJMaterial *material;
  uint uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  Vec3fa Ng;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  DifferentialGeometry local_118;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined1 local_68 [12];
  float fStack_5c;
  float fStack_58;
  uint local_54;
  uint uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  
  if (data->motion_blur == true) {
    uVar3 = y << 0x10 | x;
    uVar3 = uVar3 * -0x3361d2af >> 0x11 | uVar3 * 0x16a88000;
    uVar3 = (uVar3 * -0x194da000 | uVar3 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
    uVar3 = (uVar3 * 0x2000 | uVar3 >> 0x13) * 5 + 0xe6546b64;
    uVar3 = (uVar3 >> 0x10 ^ uVar3) * -0x7a143595;
    uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
    time = (float)((uVar3 >> 0x10 ^ uVar3) * 0x19660d + 0x3c6ef35f >> 1) * 4.656613e-10;
  }
  fVar6 = (float)x;
  fVar10 = (float)y;
  local_88 = (camera->xfm).l.vz.field_0.field_0.x +
             fVar10 * (camera->xfm).l.vy.field_0.field_0.x +
             fVar6 * (camera->xfm).l.vx.field_0.field_0.x;
  fStack_84 = (camera->xfm).l.vz.field_0.field_0.y +
              fVar10 * (camera->xfm).l.vy.field_0.field_0.y +
              fVar6 * (camera->xfm).l.vx.field_0.field_0.y;
  fVar5 = (camera->xfm).l.vz.field_0.field_0.z +
          fVar10 * (camera->xfm).l.vy.field_0.field_0.z +
          fVar6 * (camera->xfm).l.vx.field_0.field_0.z;
  fVar6 = fVar10 * 0.0 + fVar6 * 0.0 + 0.0;
  fVar10 = fStack_84 * fStack_84;
  fVar9 = fVar5 * fVar5;
  fVar6 = fVar6 * fVar6;
  fVar11 = fVar10 + local_88 * local_88 + fVar9;
  fVar12 = fVar10 + fVar10 + fVar6;
  fVar9 = fVar10 + fVar9 + fVar9;
  fVar6 = fVar10 + fVar6 + fVar6;
  auVar7._4_4_ = fVar12;
  auVar7._0_4_ = fVar11;
  auVar7._8_4_ = fVar9;
  auVar7._12_4_ = fVar6;
  auVar8._4_4_ = fVar12;
  auVar8._0_4_ = fVar11;
  auVar8._8_4_ = fVar9;
  auVar8._12_4_ = fVar6;
  auVar8 = rsqrtss(auVar7,auVar8);
  fVar6 = auVar8._0_4_;
  fStack_80 = fVar6 * fVar6 * fVar11 * -0.5 * fVar6 + fVar6 * 1.5;
  local_88 = fStack_80 * local_88;
  fStack_84 = fStack_80 * fStack_84;
  fStack_80 = fStack_80 * fVar5;
  local_98.m128[2] =
       (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_98._0_8_ = *(undefined8 *)&(camera->xfm).p.field_0;
  local_98.m128[3] = 0.0;
  local_78 = 0xffffffff7f800000;
  local_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  uStack_48 = 0xffffffff;
  fStack_7c = time;
  rtcTraversableIntersect1(data->traversable,&local_98);
  stats->numRays = stats->numRays + 1;
  if (uStack_50 == 0xffffffff) {
    pixels[width * y + x] = 0;
  }
  else {
    local_118.geomID = uStack_50;
    local_118.primID = local_54;
    local_118.P.field_0.m128[0] = (float)local_78 * local_88 + local_98.m128[0];
    local_118.P.field_0.m128[1] = (float)local_78 * fStack_84 + local_98.m128[1];
    local_118.P.field_0.m128[2] = (float)local_78 * fStack_80 + local_98.m128[2];
    local_118.P.field_0.m128[3] = (float)local_78 * fStack_7c + local_98.m128[3];
    local_118.u = fStack_5c;
    local_118.v = fStack_58;
    local_118.Ng.field_0.m128[3] = 0.0;
    local_118.Ng.field_0.m128[0] = (float)local_68._0_4_;
    local_118.Ng.field_0.m128[1] = (float)local_68._4_4_;
    local_118.Ng.field_0.m128[2] = (float)local_68._8_4_;
    local_118.Ns.field_0.m128[3] = 0.0;
    local_118.Ns.field_0.m128[0] = (float)local_68._0_4_;
    local_118.Ns.field_0.m128[1] = (float)local_68._4_4_;
    local_118.Ns.field_0.m128[2] = (float)local_68._8_4_;
    uVar3 = postIntersect(data,(Ray *)&local_98.field_1,&local_118);
    fVar5 = local_118.Ng.field_0.m128[1] * local_118.Ng.field_0.m128[1];
    fVar6 = local_118.Ng.field_0.m128[2] * local_118.Ng.field_0.m128[2];
    fVar10 = local_118.Ng.field_0.m128[3] * local_118.Ng.field_0.m128[3];
    fVar9 = fVar5 + local_118.Ng.field_0.m128[0] * local_118.Ng.field_0.m128[0] + fVar6;
    fVar11 = fVar5 + fVar5 + fVar10;
    fVar6 = fVar5 + fVar6 + fVar6;
    fVar10 = fVar5 + fVar10 + fVar10;
    auVar14._4_4_ = fVar11;
    auVar14._0_4_ = fVar9;
    auVar14._8_4_ = fVar6;
    auVar14._12_4_ = fVar10;
    auVar2._4_4_ = fVar11;
    auVar2._0_4_ = fVar9;
    auVar2._8_4_ = fVar6;
    auVar2._12_4_ = fVar10;
    rsqrtss(auVar14,auVar2);
    fVar5 = local_118.Ns.field_0.m128[1] * local_118.Ns.field_0.m128[1];
    fVar6 = local_118.Ns.field_0.m128[2] * local_118.Ns.field_0.m128[2];
    fVar10 = local_118.Ns.field_0.m128[3] * local_118.Ns.field_0.m128[3];
    fVar9 = fVar5 + local_118.Ns.field_0.m128[0] * local_118.Ns.field_0.m128[0] + fVar6;
    auVar15._0_8_ = CONCAT44(fVar5 + fVar5 + fVar10,fVar9);
    auVar15._8_4_ = fVar5 + fVar6 + fVar6;
    auVar15._12_4_ = fVar5 + fVar10 + fVar10;
    auVar13._8_4_ = auVar15._8_4_;
    auVar13._0_8_ = auVar15._0_8_;
    auVar13._12_4_ = auVar15._12_4_;
    auVar8 = rsqrtss(auVar13,auVar15);
    fVar5 = auVar8._0_4_;
    fVar5 = fVar5 * 1.5 - fVar5 * fVar5 * fVar9 * 0.5 * fVar5;
    fVar6 = fVar5 * local_118.Ns.field_0.m128[0];
    fVar10 = fVar5 * local_118.Ns.field_0.m128[1];
    fVar5 = fVar5 * local_118.Ns.field_0.m128[2];
    if (0.0 <= fStack_80 * fVar5 + fStack_84 * fVar10 + local_88 * fVar6) {
      fVar6 = -fVar6;
      fVar10 = -fVar10;
      fVar5 = -fVar5;
    }
    pIVar1 = data->ispc_scene->materials[(int)uVar3];
    if (pIVar1->type == 0) {
      uVar4._0_4_ = pIVar1[3].type;
      uVar4._4_4_ = pIVar1[3].align[0];
      fVar9 = (float)*(undefined8 *)(pIVar1[3].align + 1);
    }
    else {
      uVar4 = 0x3f0000003f000000;
      fVar9 = 0.5;
    }
    fVar6 = fVar5 * -fStack_80 + fVar10 * -fStack_84 + fVar6 * -local_88;
    fVar5 = fVar6 * (float)uVar4;
    fVar10 = fVar6 * (float)((ulong)uVar4 >> 0x20);
    fVar6 = fVar6 * fVar9;
    if (1.0 <= fVar5) {
      fVar5 = 1.0;
    }
    fVar9 = 0.0;
    if (0.0 <= fVar5) {
      fVar9 = fVar5;
    }
    if (1.0 <= fVar10) {
      fVar10 = 1.0;
    }
    fVar5 = 0.0;
    if (0.0 <= fVar10) {
      fVar5 = fVar10;
    }
    if (1.0 <= fVar6) {
      fVar6 = 1.0;
    }
    fVar10 = 0.0;
    if (0.0 <= fVar6) {
      fVar10 = fVar6;
    }
    pixels[width * y + x] =
         (int)(long)(fVar5 * 255.0) * 0x100 + (int)(long)(fVar9 * 255.0) +
         (int)(long)(fVar10 * 255.0) * 0x10000;
  }
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y, 
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera,
                         RayStats& stats,
                         const RTCFeatureFlags feature_mask)
{
  /* initialize sampler */
  RandomSampler sampler;
  RandomSampler_init(sampler, (int)x, (int)y, 0);

  /* initialize ray */
  float ray_time = data.motion_blur ? RandomSampler_get1D(sampler) : time;
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf, ray_time);

  /* intersect ray with scene */
  RTCIntersectArguments args;
  rtcInitIntersectArguments(&args);
  args.flags = data.iflags_coherent;
#if RTC_MIN_WIDTH
  args.minWidthDistanceFactor = 0.5f*data.min_width/width;
#endif
  args.feature_mask = feature_mask;
  
  rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
  RayStats_addRay(stats);

  /* shade background black */
  if (ray.geomID == RTC_INVALID_GEOMETRY_ID) {
    pixels[y*width+x] = 0;
    return;
  }

  /* shade all rays that hit something */
  Vec3fa color = Vec3fa(0.5f);

  /* compute differential geometry */
  DifferentialGeometry dg;
  dg.geomID = ray.geomID;
  dg.primID = ray.primID;
  dg.u = ray.u;
  dg.v = ray.v;
  dg.P  = ray.org+ray.tfar*ray.dir;
  dg.Ng = ray.Ng;
  dg.Ns = ray.Ng;

#if 0
  if (data.use_smooth_normals)
    if (ray.geomID != RTC_INVALID_GEOMETRY_ID) // FIXME: workaround for ISPC bug, location reached with empty execution mask
    {
      Vec3fa dPdu,dPdv;
      auto geomID = ray.geomID; {
        rtcInterpolate1(rtcGetGeometry(data.scene,geomID),ray.primID,ray.u,ray.v,RTC_BUFFER_TYPE_VERTEX,0,nullptr,&dPdu.x,&dPdv.x,3);
      }
      dg.Ns = cross(dPdv,dPdu);
    }
#endif

  int materialID = postIntersect(data,ray,dg);
  dg.Ng = face_forward(ray.dir,normalize(dg.Ng));
  dg.Ns = face_forward(ray.dir,normalize(dg.Ns));

  /* shade */
  if (data.ispc_scene->materials[materialID]->type == MATERIAL_OBJ) {
    ISPCOBJMaterial* material = (ISPCOBJMaterial*) data.ispc_scene->materials[materialID];
    color = Vec3fa(material->Kd);
  }

  color = color*dot(neg(ray.dir),dg.Ns);

  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}